

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::NegativeAPIBind::Run(NegativeAPIBind *this)

{
  GLenum GVar1;
  undefined8 in_RAX;
  CallLogWrapper *this_00;
  char *format;
  GLint alignment;
  GLint bindings;
  undefined8 local_18;
  
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  local_18 = in_RAX;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90dd,(GLint *)((long)&local_18 + 4));
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90df,(GLint *)&local_18);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,local_18._4_4_,0);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,local_18._4_4_,0,0,0);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,0,0,(long)((int)local_18 + -1),0);
      GVar1 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar1 == 0x501) {
        return 0;
      }
      format = 
      "INVALID_VALUE is generated by BindBufferRange if <target> is\nSHADER_STORAGE_BUFFER and <offset> is not a multiple of the value of\nSHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT.\n"
      ;
    }
    else {
      format = 
      "INVALID_VALUE is generated by BindBufferRange if <target> is\nSHADER_STORAGE_BUFFER and <index> is greater than or equal to the value of\nMAX_SHADER_STORAGE_BUFFER_BINDINGS.\n"
      ;
    }
  }
  else {
    format = 
    "INVALID_VALUE is generated by BindBufferBase if <target> is\nSHADER_STORAGE_BUFFER and <index> is greater than or equal to the value of\nMAX_SHADER_STORAGE_BUFFER_BINDINGS.\n"
    ;
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		GLint bindings;
		GLint alignment;
		glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &bindings);
		glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &alignment);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, bindings, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by BindBufferBase if <target> is\n"
				   "SHADER_STORAGE_BUFFER and <index> is greater than or equal to the value of\n"
				   "MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n");
			return ERROR;
		}

		glBindBufferRange(GL_SHADER_STORAGE_BUFFER, bindings, 0, 0, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by BindBufferRange if <target> is\n"
				   "SHADER_STORAGE_BUFFER and <index> is greater than or equal to the value of\n"
				   "MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n");
			return ERROR;
		}

		glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 0, alignment - 1, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by BindBufferRange if <target> is\n"
				   "SHADER_STORAGE_BUFFER and <offset> is not a multiple of the value of\n"
				   "SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT.\n");
			return ERROR;
		}

		return NO_ERROR;
	}